

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

uint getaddrinfo_thread(void *arg)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  char buf [1];
  char service [12];
  undefined1 local_2d;
  char local_2c [12];
  
  pvVar1 = *(void **)((long)arg + 0x68);
  curl_msnprintf(local_2c,0xc,"%d",(ulong)*(uint *)((long)arg + 0xc));
  iVar2 = Curl_getaddrinfo_ex(*(char **)((long)arg + 0x10),local_2c,(addrinfo *)((long)arg + 0x38),
                              (Curl_addrinfo **)((long)arg + 0x30));
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      iVar2 = *piVar3;
    }
    *(int *)((long)arg + 0x28) = iVar2;
  }
  pthread_mutex_lock(*arg);
  if (*(int *)((long)arg + 8) == 0) {
    if (*(int *)((long)arg + 0x24) != -1) {
      local_2d = 1;
      sVar4 = write(*(int *)((long)arg + 0x24),&local_2d,1);
      if (sVar4 < 0) {
        piVar3 = __errno_location();
        *(int *)((long)arg + 0x28) = *piVar3;
      }
    }
    *(undefined4 *)((long)arg + 8) = 1;
    pthread_mutex_unlock(*arg);
  }
  else {
    pthread_mutex_unlock(*arg);
    destroy_thread_sync_data((thread_sync_data *)arg);
    (*Curl_cfree)(pvVar1);
  }
  return 0;
}

Assistant:

CURL_STDCALL getaddrinfo_thread(void *arg)
{
  struct thread_sync_data *tsd = (struct thread_sync_data *)arg;
  struct thread_data *td = tsd->td;
  char service[12];
  int rc;
#ifndef CURL_DISABLE_SOCKETPAIR
#ifdef USE_EVENTFD
  const void *buf;
  const uint64_t val = 1;
#else
  char buf[1];
#endif
#endif

  msnprintf(service, sizeof(service), "%d", tsd->port);

  rc = Curl_getaddrinfo_ex(tsd->hostname, service, &tsd->hints, &tsd->res);

  if(rc) {
    tsd->sock_error = SOCKERRNO?SOCKERRNO:rc;
    if(tsd->sock_error == 0)
      tsd->sock_error = RESOLVER_ENOMEM;
  }
  else {
    Curl_addrinfo_set_port(tsd->res, tsd->port);
  }

  Curl_mutex_acquire(tsd->mtx);
  if(tsd->done) {
    /* too late, gotta clean up the mess */
    Curl_mutex_release(tsd->mtx);
    destroy_thread_sync_data(tsd);
    free(td);
  }
  else {
#ifndef CURL_DISABLE_SOCKETPAIR
    if(tsd->sock_pair[1] != CURL_SOCKET_BAD) {
#ifdef USE_EVENTFD
      buf = &val;
#else
      buf[0] = 1;
#endif
      /* DNS has been resolved, signal client task */
      if(wakeup_write(tsd->sock_pair[1], buf, sizeof(buf)) < 0) {
        /* update sock_erro to errno */
        tsd->sock_error = SOCKERRNO;
      }
    }
#endif
    tsd->done = 1;
    Curl_mutex_release(tsd->mtx);
  }

  return 0;
}